

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiss_fft.c
# Opt level: O0

kiss_fft_cfg kiss_fft_alloc(int nfft,int inverse_fft,void *mem,size_t *lenmem)

{
  size_t __size;
  ulong *in_RCX;
  kiss_fft_cfg in_RDX;
  int in_ESI;
  int in_EDI;
  double dVar1;
  double phase;
  double pi;
  int i;
  size_t memneeded;
  kiss_fft_cfg st;
  double local_40;
  int *in_stack_ffffffffffffffc8;
  int n;
  kiss_fft_cfg local_20;
  
  local_20 = (kiss_fft_cfg)0x0;
  __size = (long)(in_EDI + -1) * 8 + 0x110;
  if (in_RCX == (ulong *)0x0) {
    local_20 = (kiss_fft_cfg)malloc(__size);
  }
  else {
    if ((in_RDX != (kiss_fft_cfg)0x0) && (__size <= *in_RCX)) {
      local_20 = in_RDX;
    }
    *in_RCX = __size;
  }
  if (local_20 != (kiss_fft_cfg)0x0) {
    local_20->nfft = in_EDI;
    local_20->inverse = in_ESI;
    for (n = 0; n < in_EDI; n = n + 1) {
      in_stack_ffffffffffffffc8 = (int *)0x400921fb54442d18;
      local_40 = ((double)n * -6.283185307179586) / (double)in_EDI;
      if (local_20->inverse != 0) {
        local_40 = local_40 * -1.0;
      }
      dVar1 = cos(local_40);
      local_20->twiddles[n].r = (float)dVar1;
      dVar1 = sin(local_40);
      local_20->twiddles[n].i = (float)dVar1;
    }
    kf_factor(n,in_stack_ffffffffffffffc8);
  }
  return local_20;
}

Assistant:

kiss_fft_cfg kiss_fft_alloc(int nfft,int inverse_fft,void * mem,size_t * lenmem )
{
    kiss_fft_cfg st=NULL;
    size_t memneeded = sizeof(struct kiss_fft_state)
        + sizeof(kiss_fft_cpx)*(nfft-1); /* twiddle factors*/

    if ( lenmem==NULL ) {
        st = ( kiss_fft_cfg)KISS_FFT_MALLOC( memneeded );
    }else{
        if (mem != NULL && *lenmem >= memneeded)
            st = (kiss_fft_cfg)mem;
        *lenmem = memneeded;
    }
    if (st) {
        int i;
        st->nfft=nfft;
        st->inverse = inverse_fft;

        for (i=0;i<nfft;++i) {
            const double pi=3.141592653589793238462643383279502884197169399375105820974944;
            double phase = -2*pi*i / nfft;
            if (st->inverse)
                phase *= -1;
            kf_cexp(st->twiddles+i, phase );
        }

        kf_factor(nfft,st->factors);
    }
    return st;
}